

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O3

Color __thiscall Renderer::radiance(Renderer *this,Ray ray,Sampler *sampler)

{
  Light *pLVar1;
  BSDF *this_00;
  pointer ppLVar2;
  undefined1 auVar3 [16];
  double dVar4;
  int iVar5;
  pointer ppLVar6;
  ulong uVar7;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar8;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dc_01;
  float extraout_XMM0_Dc_02;
  float extraout_XMM0_Dc_03;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  float extraout_XMM0_Dd_03;
  float in_XMM1_Da;
  float fVar9;
  Color CVar10;
  Ray shadowray;
  HitInfo hit;
  HitInfo shadowhit;
  float local_194;
  char local_18d;
  float local_18c;
  undefined1 local_188 [8];
  undefined8 uStack_180;
  undefined8 local_170;
  float local_168;
  Sampler *local_160;
  float local_154;
  undefined8 local_150;
  float local_148;
  undefined8 local_144;
  float local_13c;
  float local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  ulong local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  HitInfo local_f8;
  vec3f local_a8;
  float local_9c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_18d = '\x01';
  if (this->max_bounces < 0) {
    local_194 = 0.0;
    local_188 = (undefined1  [8])0x0;
  }
  else {
    local_138 = 1.0;
    uStack_134 = 0;
    uStack_130 = 0;
    uStack_12c = 0;
    local_188 = (undefined1  [8])0x0;
    uStack_180 = 0;
    uVar7 = 0;
    local_194 = 0.0;
    _local_128 = _DAT_00155730;
    local_160 = sampler;
    while( true ) {
      (**this->acc->_vptr_Accelarator)(&local_f8,this->acc,&ray);
      if (local_f8.super_Hit.hit == false) break;
      pLVar1 = (local_f8.object)->emission;
      if ((pLVar1 != (Light *)0x0) && ((local_18d != '\0' || (pLVar1->samplable == false)))) {
        (*pLVar1->_vptr_Light[1])(pLVar1,&ray);
        in_XMM1_Da = in_XMM1_Da * local_138;
        local_188._0_4_ = (float)local_188._0_4_ + extraout_XMM0_Da * (float)local_128._0_4_;
        local_188._4_4_ = (float)local_188._4_4_ + extraout_XMM0_Db * (float)local_128._4_4_;
        uStack_180._0_4_ = (float)uStack_180 + extraout_XMM0_Dc * fStack_120;
        uStack_180._4_4_ = uStack_180._4_4_ + extraout_XMM0_Dd * fStack_11c;
        local_194 = local_194 + in_XMM1_Da;
      }
      this_00 = (local_f8.object)->bsdf;
      if (this_00 == (BSDF *)0x0) goto LAB_0011c65b;
      local_110 = uVar7;
      BSDF::bump(this_00,&local_f8);
      ppLVar2 = (this->samplable_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppLVar6 = (this->samplable_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppLVar6 != ppLVar2;
          ppLVar6 = ppLVar6 + 1) {
        local_170 = 0;
        local_168 = 0.0;
        (**(*ppLVar6)->_vptr_Light)(*ppLVar6,&local_f8.super_Hit.p,&local_170,&local_18c,local_160);
        local_108 = CONCAT44(local_108._4_4_,in_XMM1_Da);
        in_XMM1_Da = (float)((uint)ray.dir.z ^ (uint)DAT_00153050);
        local_a8.y = (float)((uint)ray.dir.y ^ DAT_00153050._4_4_);
        local_a8.x = (float)((uint)ray.dir.x ^ (uint)DAT_00153050);
        local_a8.z = in_XMM1_Da;
        local_48 = extraout_XMM0_Da_00;
        fStack_44 = extraout_XMM0_Db_00;
        fStack_40 = extraout_XMM0_Dc_00;
        fStack_3c = extraout_XMM0_Dd_00;
        (**this_00->_vptr_BSDF)(this_00,&local_a8,&local_170,&local_f8);
        if ((((extraout_XMM0_Da_01 != 0.0) || (NAN(extraout_XMM0_Da_01))) ||
            (extraout_XMM0_Db_01 != 0.0)) ||
           (((NAN(extraout_XMM0_Db_01) || (in_XMM1_Da != 0.0)) || (NAN(in_XMM1_Da))))) {
          fVar8 = this->geoEPS;
          local_18c = local_18c - fVar8;
          local_150 = CONCAT44(local_f8.super_Hit.p.y + fVar8 * (float)((ulong)local_170 >> 0x20),
                               local_f8.super_Hit.p.x + fVar8 * (float)local_170);
          local_148 = fVar8 * local_168 + local_f8.super_Hit.p.z;
          local_144 = local_170;
          local_13c = local_168;
          local_154 = in_XMM1_Da;
          local_58 = extraout_XMM0_Da_01;
          fStack_54 = extraout_XMM0_Db_01;
          fStack_50 = extraout_XMM0_Dc_01;
          fStack_4c = extraout_XMM0_Dd_01;
          (**this->acc->_vptr_Accelarator)(&local_a8,this->acc,&local_150);
          if (local_a8.x._0_1_ == '\x01') {
            in_XMM1_Da = (1.0 - this->geoEPS) * local_18c;
            if (SQRT((local_9c - local_148) * (local_9c - local_148) +
                     (local_a8.y - (float)local_150) * (local_a8.y - (float)local_150) +
                     (local_a8.z - local_150._4_4_) * (local_a8.z - local_150._4_4_)) <= in_XMM1_Da)
            goto LAB_0011c38b;
          }
          fVar8 = ABS(local_f8.super_Hit.Ns.z * local_168 +
                      local_f8.super_Hit.Ns.x * (float)local_170 +
                      local_f8.super_Hit.Ns.y * local_170._4_4_);
          in_XMM1_Da = (float)local_188._0_4_ + fVar8 * local_48 * (float)local_128._0_4_ * local_58
          ;
          local_188._4_4_ =
               (float)local_188._4_4_ + fVar8 * fStack_44 * (float)local_128._4_4_ * fStack_54;
          local_188._0_4_ = in_XMM1_Da;
          uStack_180._0_4_ = (float)uStack_180 + fVar8 * fStack_40 * fStack_120 * fStack_50;
          uStack_180._4_4_ = uStack_180._4_4_ + fVar8 * fStack_3c * fStack_11c * fStack_4c;
          local_194 = local_194 + (float)local_108 * local_138 * local_154 * fVar8;
        }
LAB_0011c38b:
      }
      local_a8.x = 0.0;
      local_a8.y = 0.0;
      local_a8.z = 0.0;
      fVar8 = (float)((uint)ray.dir.z ^ (uint)DAT_00153050);
      local_150 = CONCAT44((uint)ray.dir.y ^ DAT_00153050._4_4_,(uint)ray.dir.x ^ (uint)DAT_00153050
                          );
      local_148 = fVar8;
      (*this_00->_vptr_BSDF[1])(this_00,&local_150,&local_a8,&local_f8,&local_18d,local_160);
      fVar9 = ABS(local_f8.super_Hit.Ns.z * local_a8.z +
                  local_f8.super_Hit.Ns.x * local_a8.x + local_a8.y * local_f8.super_Hit.Ns.y);
      local_128._0_4_ = (float)local_128._0_4_ * fVar9 * extraout_XMM0_Da_02;
      local_128._4_4_ = (float)local_128._4_4_ * fVar9 * extraout_XMM0_Db_02;
      fStack_120 = fStack_120 * fVar9 * extraout_XMM0_Dc_02;
      fStack_11c = fStack_11c * fVar9 * extraout_XMM0_Dd_02;
      local_138 = local_138 * fVar8 * fVar9;
      if (((((float)local_128._0_4_ == 0.0) && (!NAN((float)local_128._0_4_))) &&
          (((float)local_128._4_4_ == 0.0 &&
           (((!NAN((float)local_128._4_4_) && (local_138 == 0.0)) && (!NAN(local_138))))))) ||
         (1e+20 <= local_138 * local_138 +
                   (float)local_128._0_4_ * (float)local_128._0_4_ +
                   (float)local_128._4_4_ * (float)local_128._4_4_)) goto LAB_0011c65b;
      fVar8 = (float)local_128._4_4_;
      if ((float)local_128._4_4_ <= (float)local_128._0_4_) {
        fVar8 = (float)local_128._0_4_;
      }
      fVar9 = (float)(~-(uint)NAN((float)local_128._0_4_) & (uint)fVar8 |
                     -(uint)NAN((float)local_128._0_4_) & local_128._4_4_);
      fVar8 = local_138;
      if (local_138 <= fVar9) {
        fVar8 = fVar9;
      }
      dVar4 = (double)(float)(-(uint)NAN(fVar9) & (uint)local_138 | ~-(uint)NAN(fVar9) & (uint)fVar8
                             );
      if (0.1 <= dVar4) {
        iVar5 = (int)local_110;
      }
      else {
        dVar4 = dVar4 / 0.3;
        local_108 = CONCAT44((int)((ulong)dVar4 >> 0x20),(float)dVar4);
        uStack_100 = 0;
        (**local_160->_vptr_Sampler)();
        iVar5 = (int)local_110;
        if ((float)local_108 <= extraout_XMM0_Da_03) goto LAB_0011c65b;
        local_138 = local_138 / (float)local_108;
        auVar3._4_4_ = (float)local_108;
        auVar3._0_4_ = (float)local_108;
        auVar3._8_4_ = (float)local_108;
        auVar3._12_4_ = (float)local_108;
        _local_128 = divps(_local_128,auVar3);
      }
      fVar8 = this->geoEPS;
      ray.origin.x = local_f8.super_Hit.p.x + fVar8 * local_a8.x;
      ray.origin.y = local_f8.super_Hit.p.y + fVar8 * local_a8.y;
      in_XMM1_Da = fVar8 * local_a8.z + local_f8.super_Hit.p.z;
      ray.dir.x = local_a8.x;
      ray.dir.y = local_a8.y;
      uVar7 = (ulong)(iVar5 + 1);
      ray.origin.z = in_XMM1_Da;
      ray.dir.z = local_a8.z;
      if (this->max_bounces <= iVar5) goto LAB_0011c65b;
    }
    ppLVar6 = (this->global_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppLVar2 = (this->global_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppLVar6 == ppLVar2) {
    }
    else {
      do {
        fVar8 = local_194;
        (*(*ppLVar6)->_vptr_Light[1])(*ppLVar6,&ray);
        local_194 = local_194 + fVar8 * local_138;
        local_188 = (undefined1  [8])
                    CONCAT44((float)local_188._4_4_ + extraout_XMM0_Db_03 * (float)local_128._4_4_,
                             (float)local_188._0_4_ + extraout_XMM0_Da_04 * (float)local_128._0_4_);
        uStack_180._0_4_ = (float)uStack_180 + extraout_XMM0_Dc_03 * fStack_120;
        uStack_180._4_4_ = uStack_180._4_4_ + extraout_XMM0_Dd_03 * fStack_11c;
        ppLVar6 = ppLVar6 + 1;
      } while (ppLVar6 != ppLVar2);
    }
  }
LAB_0011c65b:
  CVar10.z = local_194;
  CVar10.x = (float)SUB84(local_188,0);
  CVar10.y = (float)(int)((ulong)local_188 >> 0x20);
  return CVar10;
}

Assistant:

Color Renderer::radiance(Ray ray, Sampler& sampler)
{
	Color through(1);
	Color result;
	bool lastDirac = true; // accept all light sources if directly into camera
	for (int nbounce = 0; nbounce <= max_bounces; nbounce++)
	{
		HitInfo hit = acc->hit(ray);
		if (!hit) {
			for (Light* l: global_lights)
				result += through * l->radiance(ray);
			break;
		}
		if (hit.object->emission) {
			if (lastDirac || !hit.object->emission->samplable)
				result += through * hit.object->emission->radiance(ray);
		}
		BSDF* bsdf = hit.object->bsdf;
		if (!bsdf) break;
		bsdf->bump(hit);
		// direct light
		for (Light* l: samplable_lights) {
			vec3f dirToLight;
			float dist;
			Color irr = l->sampleIrradiance(hit.p, dirToLight, dist, sampler);
			Color f = bsdf->f(-ray.dir, dirToLight, hit);
			if (f == vec3f(0)) continue;
			dist -= geoEPS; // cancel amount that ray origin is moved forward
			// shadow ray test
			Ray shadowray(hit.p + geoEPS * dirToLight, dirToLight);
			HitInfo shadowhit = acc->hit(shadowray);
			if (!shadowhit || norm(shadowhit.p - shadowray.origin) > (1-geoEPS) * dist)
				result += through * irr * f * fabs(dot(hit.Ns, dirToLight));
		}
		// indirect light (bsdf importance sampling)
		vec3f newdir;
		Color f = bsdf->sample_f(-ray.dir, newdir, hit, lastDirac, sampler); // already scaled by 1/pdf
		through *= fabs(dot(newdir, hit.Ns)) * f;
		if (through == vec3f() || !(sqrlen(through) < 1e20)) break;
		// russian roulette
		float t = fmax(fmax(through.x, through.y), through.z);
		if (t < 0.1) {
			float p = t / 0.3;
			if (sampler.get1f() >= p) break;
			through = through / p;
		}
		ray = Ray(hit.p + geoEPS*newdir, newdir);
	}
	return result;
}